

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

Id __thiscall spv::Builder::getDerefTypeId(Builder *this,Id resultId)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  Id IVar3;
  ulong uVar4;
  
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar2 = ppIVar1[resultId];
  if (pIVar2 == (Instruction *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)pIVar2->typeId;
  }
  pIVar2 = ppIVar1[uVar4];
  if (pIVar2->opCode == OpTypePointer) {
    IVar3 = Instruction::getIdOperand(pIVar2,1);
    return IVar3;
  }
  __assert_fail("isPointerType(typeId)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x546,"Id spv::Builder::getDerefTypeId(Id) const");
}

Assistant:

spv::Id getTypeId(Id resultId) const {
        return idToInstruction[resultId] == nullptr ? NoType : idToInstruction[resultId]->getTypeId();
    }